

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.h
# Opt level: O1

void __thiscall GmmLib::AuxTable::AuxTable(AuxTable *this,GmmClientContext *pClientContextIn)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  
  PageTable::PageTable(&this->super_PageTable,0x8000,0x1000,AUXTT);
  iVar1 = (*pClientContextIn->_vptr_GmmClientContext[3])(pClientContextIn);
  iVar2 = 0x2000;
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0x45) & 0x40) == 0) {
    iVar1 = (*pClientContextIn->_vptr_GmmClientContext[3])(pClientContextIn);
    iVar2 = (uint)(*(byte *)(CONCAT44(extraout_var_00,iVar1) + 0x45) >> 7) * 0x1000 + 0x1000;
  }
  this->L1Size = iVar2;
  this->NullL2Table = (Table *)0x0;
  this->NullL1Table = (Table *)0x0;
  this->NullCCSTile = 0;
  return;
}

Assistant:

AuxTable(GmmClientContext *pClientContextIn)
            : PageTable(8 * PAGE_SIZE, GMM_AUX_L3_SIZE, TT_TYPE::AUXTT), L1Size((WA16K(pClientContextIn->GetLibContext()) || WA64K(pClientContextIn->GetLibContext())) ? (2 * PAGE_SIZE) : PAGE_SIZE)
        {
            NullL2Table = nullptr;
            NullL1Table = nullptr;
            NullCCSTile = 0;
        }